

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

BCRec * __thiscall
amrex::StateData::getBC(BCRec *__return_storage_ptr__,StateData *this,int comp,int i)

{
  BCRec *pBVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Box local_34;
  
  __return_storage_ptr__->bc[4] = -0x29a;
  __return_storage_ptr__->bc[5] = -0x29a;
  __return_storage_ptr__->bc[0] = -0x29a;
  __return_storage_ptr__->bc[1] = -0x29a;
  __return_storage_ptr__->bc[2] = -0x29a;
  __return_storage_ptr__->bc[3] = -0x29a;
  BoxArray::operator[](&local_34,&this->grids,i);
  pBVar1 = StateDescriptor::getBC(this->desc,comp);
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    uVar3 = 0;
    uVar4 = 0;
    if (*(int *)((long)local_34.smallend.vect + lVar2) <=
        *(int *)((long)(this->domain).smallend.vect + lVar2)) {
      uVar4 = *(undefined4 *)((long)pBVar1->bc + lVar2);
    }
    *(undefined4 *)((long)__return_storage_ptr__->bc + lVar2) = uVar4;
    if (*(int *)((long)(this->domain).bigend.vect + lVar2) <=
        *(int *)((long)local_34.bigend.vect + lVar2)) {
      uVar3 = *(undefined4 *)((long)pBVar1->bc + lVar2 + 0xc);
    }
    *(undefined4 *)((long)__return_storage_ptr__->bc + lVar2 + 0xc) = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

BCRec
StateData::getBC (int comp, int i) const noexcept
{
    BCRec bcr;
    amrex::setBC(grids[i],domain,desc->getBC(comp),bcr);
    return bcr;
}